

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O1

void anon_unknown.dwarf_ff5::sp
               (Array2D<Imf_2_5::Rgba> *px,int w,int h,float xc,float yc,float rc,float rd,float gn,
               float bl,float lm)

{
  short sVar1;
  Rgba *pRVar2;
  unsigned_short uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  fVar9 = floorf(yc - rc);
  fVar13 = 0.0;
  if (0.0 <= fVar9) {
    fVar13 = fVar9;
  }
  fVar10 = ceilf(yc + rc);
  fVar9 = (float)h + -1.0;
  if (fVar10 <= (float)h + -1.0) {
    fVar9 = fVar10;
  }
  if ((int)fVar13 <= (int)fVar9) {
    fVar11 = ceilf(xc + rc);
    fVar10 = (float)w + -1.0;
    if (fVar11 <= (float)w + -1.0) {
      fVar10 = fVar11;
    }
    fVar12 = floorf(xc - rc);
    fVar11 = 0.0;
    if (0.0 <= fVar12) {
      fVar11 = fVar12;
    }
    lVar6 = (long)(int)fVar13;
    do {
      if ((int)fVar11 <= (int)fVar10) {
        fVar13 = ((float)(int)lVar6 - yc) / rc;
        lVar7 = (long)(int)fVar11;
        do {
          fVar12 = ((float)(int)lVar7 - xc) / rc;
          fVar14 = fVar12 * fVar12 + fVar13 * fVar13;
          if (fVar14 < 0.0) {
            fVar14 = sqrtf(fVar14);
          }
          else {
            fVar14 = SQRT(fVar14);
          }
          if (fVar14 < 1.0) {
            fVar15 = 1.0 - fVar14 * fVar14;
            if (fVar15 < 0.0) {
              fVar15 = sqrtf(fVar15);
            }
            else {
              fVar15 = SQRT(fVar15);
            }
            fVar12 = fVar15 * 0.7071 + fVar12 * 0.42426 + fVar13 * -0.56568;
            fVar16 = (float)(-(uint)(fVar12 < 0.0) & (uint)(fVar12 * -0.1) |
                            ~-(uint)(fVar12 < 0.0) & (uint)fVar12);
            uVar4 = 0x32;
            fVar15 = 1.0;
            fVar12 = fVar16;
            do {
              if ((uVar4 & 1) != 0) {
                fVar15 = fVar15 * fVar12;
              }
              fVar12 = fVar12 * fVar12;
              uVar8 = (uint)uVar4;
              uVar4 = uVar4 >> 1;
            } while (1 < uVar8);
            uVar8 = -(uint)(rc + -1.0 < fVar14 * rc);
            fVar12 = (float)(~uVar8 & 0x3f800000 | (uint)(rc - fVar14 * rc) & uVar8);
            fVar16 = fVar16 + fVar15 * 4.0;
            lVar5 = px->_sizeY * lVar6;
            pRVar2 = px->_data;
            fVar15 = 1.0 - fVar12;
            fVar14 = *(float *)((long)&half::_toFloat + (ulong)pRVar2[lVar5 + lVar7].r._h * 4) *
                     fVar15 + fVar16 * rd * lm * fVar12;
            if ((fVar14 != 0.0) || (NAN(fVar14))) {
              sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar14 >> 0x17) * 2);
              if (sVar1 == 0) {
                uVar3 = half::convert((int)fVar14);
              }
              else {
                uVar3 = sVar1 + (short)(((uint)fVar14 & 0x7fffff) + 0xfff +
                                        (uint)(((uint)fVar14 >> 0xd & 1) != 0) >> 0xd);
              }
            }
            else {
              uVar3 = (unsigned_short)((uint)fVar14 >> 0x10);
            }
            pRVar2[lVar5 + lVar7].r._h = uVar3;
            fVar14 = *(float *)((long)&half::_toFloat + (ulong)pRVar2[lVar5 + lVar7].g._h * 4) *
                     fVar15 + fVar16 * gn * lm * fVar12;
            if ((fVar14 != 0.0) || (NAN(fVar14))) {
              sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar14 >> 0x17) * 2);
              if (sVar1 == 0) {
                uVar3 = half::convert((int)fVar14);
              }
              else {
                uVar3 = sVar1 + (short)(((uint)fVar14 & 0x7fffff) + 0xfff +
                                        (uint)(((uint)fVar14 >> 0xd & 1) != 0) >> 0xd);
              }
            }
            else {
              uVar3 = (unsigned_short)((uint)fVar14 >> 0x10);
            }
            pRVar2[lVar5 + lVar7].g._h = uVar3;
            fVar12 = *(float *)((long)&half::_toFloat + (ulong)pRVar2[lVar5 + lVar7].b._h * 4) *
                     fVar15 + fVar12 * fVar16 * bl * lm;
            if ((fVar12 != 0.0) || (NAN(fVar12))) {
              sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar12 >> 0x17) * 2);
              if (sVar1 == 0) {
                uVar3 = half::convert((int)fVar12);
              }
              else {
                uVar3 = sVar1 + (short)(((uint)fVar12 & 0x7fffff) + 0xfff +
                                        (uint)(((uint)fVar12 >> 0xd & 1) != 0) >> 0xd);
              }
            }
            else {
              uVar3 = (unsigned_short)((uint)fVar12 >> 0x10);
            }
            pRVar2[lVar5 + lVar7].b._h = uVar3;
            fVar12 = 1.0 - (1.0 - *(float *)((long)&half::_toFloat +
                                            (ulong)pRVar2[lVar5 + lVar7].a._h * 4)) * fVar15;
            if ((fVar12 != 0.0) || (NAN(fVar12))) {
              sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar12 >> 0x17) * 2);
              if (sVar1 == 0) {
                uVar3 = half::convert((int)fVar12);
              }
              else {
                uVar3 = sVar1 + (short)(((uint)fVar12 & 0x7fffff) + 0xfff +
                                        (uint)(((uint)fVar12 >> 0xd & 1) != 0) >> 0xd);
              }
            }
            else {
              uVar3 = (unsigned_short)((uint)fVar12 >> 0x10);
            }
            pRVar2[lVar5 + lVar7].a._h = uVar3;
          }
          lVar7 = lVar7 + 1;
        } while ((int)fVar10 + 1 != (int)lVar7);
      }
      lVar6 = lVar6 + 1;
    } while ((int)fVar9 + 1 != (int)lVar6);
  }
  return;
}

Assistant:

void
sp (Array2D<Rgba> &px, int w, int h,
    float xc, float yc, float rc,
    float rd, float gn, float bl, float lm)
{
    int x1 = int (max ((float) floor (xc - rc),  0.0f));
    int x2 = int (min ((float) ceil  (xc + rc), w - 1.0f));
    int y1 = int (max ((float) floor (yc - rc),  0.0f));
    int y2 = int (min ((float) ceil  (yc + rc), h - 1.0f));

    for (int y = y1; y <= y2; ++y)
    {
	for (int x = x1; x <= x2; ++x)
	{
	    float xl = (x - xc) / rc;
	    float yl = (y - yc) / rc;
	    float r  = sqrt (xl * xl + yl * yl);

	    if (r >= 1)
		continue;

	    float a = 1;

	    if (r * rc > rc - 1)
		a = rc - r * rc;

	    float zl = sqrt (1 - r * r);
	    float dl = xl * 0.42426 - yl * 0.56568 + zl * 0.70710;

	    if (dl < 0)
		dl *= -0.1;

	    float hl = pw (dl, 50) * 4;
	    float dr = (dl + hl) * rd;
	    float dg = (dl + hl) * gn;
	    float db = (dl + hl) * bl;

	    Rgba &p = px[y][x];
	    p.r = p.r * (1 - a) + dr * lm * a;
	    p.g = p.g * (1 - a) + dg * lm * a;
	    p.b = p.b * (1 - a) + db * lm * a;
	    p.a = 1 - (1 - p.a) * (1 - a);
	}
    }
}